

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O2

int32 keycmp_case(hash_entry_t *entry,char *key)

{
  size_t sVar1;
  
  sVar1 = 0;
  while( true ) {
    if (entry->len == sVar1) {
      return 0;
    }
    if (entry->key[sVar1] != key[sVar1]) break;
    sVar1 = sVar1 + 1;
  }
  return (int)entry->key[sVar1] - (int)key[sVar1];
}

Assistant:

static int32
keycmp_case(hash_entry_t * entry, const char *key)
{
    char c1, c2;
    int32 i;
    const char *str;

    str = entry->key;
    for (i = 0; i < entry->len; i++) {
        c1 = *(str++);
        c2 = *(key++);
        if (c1 != c2)
            return (c1 - c2);
    }

    return 0;
}